

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O1

void wasm::EffectAnalyzer::InternalAnalyzer::doStartCatch(InternalAnalyzer *self,Expression **currp)

{
  size_t *psVar1;
  Expression *pEVar2;
  EffectAnalyzer *pEVar3;
  size_t sVar4;
  const_iterator cVar5;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *this;
  pair<std::_Rb_tree_iterator<wasm::Name>,_std::_Rb_tree_iterator<wasm::Name>_> pVar6;
  
  pEVar2 = *currp;
  if (pEVar2->_id != TryId) {
    __assert_fail("int(_id) == int(T::SpecificId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                  ,0x314,"T *wasm::Expression::cast() [T = wasm::Try]");
  }
  if (pEVar2[1].type.id != 0) {
    pEVar3 = self->parent;
    cVar5 = std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::find(&(pEVar3->delegateTargets)._M_t,(key_type *)(pEVar2 + 1));
    if (((_Rb_tree_header *)cVar5._M_node !=
         &(pEVar3->delegateTargets)._M_t._M_impl.super__Rb_tree_header) &&
       (self->parent->tryDepth == 0)) {
      self->parent->throws_ = true;
    }
    this = &self->parent->delegateTargets;
    pVar6 = std::
            _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
            ::equal_range(&this->_M_t,(key_type *)(pEVar2 + 1));
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_M_erase_aux(&this->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
  }
  if (*(long *)(pEVar2 + 5) - *(long *)(pEVar2 + 3) == 1) {
    sVar4 = self->parent->tryDepth;
    if (sVar4 == 0) {
      __assert_fail("self->parent.tryDepth > 0 && \"try depth cannot be negative\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/effects.h"
                    ,0x193,
                    "static void wasm::EffectAnalyzer::InternalAnalyzer::doStartCatch(InternalAnalyzer *, Expression **)"
                   );
    }
    self->parent->tryDepth = sVar4 - 1;
  }
  psVar1 = &self->parent->catchDepth;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

static void doStartCatch(InternalAnalyzer* self, Expression** currp) {
      Try* curr = (*currp)->cast<Try>();
      // This is conservative. When an inner try-delegate targets the current
      // expression, even if the try-delegate's body can't throw, we consider
      // the current expression can throw for simplicity, unless the current
      // expression is not inside a try-catch_all. It is hard to figure out
      // whether the original try-delegate's body throws or not at this point.
      if (curr->name.is()) {
        if (self->parent.delegateTargets.count(curr->name) &&
            self->parent.tryDepth == 0) {
          self->parent.throws_ = true;
        }
        self->parent.delegateTargets.erase(curr->name);
      }
      // We only count 'try's with a 'catch_all' because instructions within a
      // 'try' without a 'catch_all' can still throw outside of the try.
      if (curr->hasCatchAll()) {
        assert(self->parent.tryDepth > 0 && "try depth cannot be negative");
        self->parent.tryDepth--;
      }
      self->parent.catchDepth++;
    }